

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrentappend.cpp
# Opt level: O0

void insert_random_elements(DuckDB *db,bool *correct,int threadnr)

{
  __int_type_conflict1 _Var1;
  pointer pMVar2;
  int in_EDX;
  long in_RSI;
  DuckDB *in_RDI;
  Value new_count;
  size_t i;
  int64_t start_count;
  Value count;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  result;
  Connection con;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  *in_stack_fffffffffffffdd8;
  allocator *paVar3;
  undefined7 in_stack_fffffffffffffde0;
  byte in_stack_fffffffffffffde7;
  __atomic_base<int> *in_stack_fffffffffffffde8;
  allocator local_1c9;
  string local_1c8 [32];
  string local_1a8 [8];
  long local_1a0;
  Value local_198 [71];
  allocator local_151;
  string local_150 [32];
  __atomic_base<int> local_130 [3];
  allocator local_121;
  string local_120 [32];
  string local_100 [8];
  ulong local_f8;
  long local_f0;
  Value local_e8 [71];
  allocator local_a1;
  string local_a0 [32];
  string local_80 [31];
  allocator local_61;
  string local_60 [32];
  string local_40 [8];
  Connection local_38 [36];
  int local_14;
  long local_10;
  
  *(undefined1 *)(in_RSI + in_EDX) = 1;
  local_14 = in_EDX;
  local_10 = in_RSI;
  duckdb::Connection::Connection(local_38,in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"BEGIN TRANSACTION;",&local_61);
  duckdb::Connection::Query(local_40);
  duckdb::
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                 *)0x77c480);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"SELECT COUNT(*) FROM integers",&local_a1);
  duckdb::Connection::Query(local_80);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  pMVar2 = duckdb::
           unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
           ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                         *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  duckdb::MaterializedQueryResult::GetValue((ulong)local_e8,(ulong)pMVar2);
  local_f0 = duckdb::Value::GetValue<long>();
  for (local_f8 = 0; local_f8 < 1000; local_f8 = local_f8 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,"INSERT INTO integers VALUES (3)",&local_121);
    duckdb::Connection::Query(local_100);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   *)0x77c5c7);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_150,"SELECT COUNT(*) FROM integers",&local_151);
    duckdb::Connection::Query((string *)local_130);
    in_stack_fffffffffffffde8 = local_130;
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator=((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                 *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                in_stack_fffffffffffffdd8);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   *)0x77c656);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
    pMVar2 = duckdb::
             unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
             ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                           *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
    duckdb::MaterializedQueryResult::GetValue((ulong)local_198,(ulong)pMVar2);
    local_1a0 = local_f0 + 1 + local_f8;
    in_stack_fffffffffffffde7 = duckdb::Value::operator!=(local_198,&local_1a0);
    if ((in_stack_fffffffffffffde7 & 1) != 0) {
      *(undefined1 *)(local_10 + local_14) = 0;
    }
    duckdb::Value::operator=(local_e8,local_198);
    duckdb::Value::~Value(local_198);
  }
  std::__atomic_base<int>::operator++(&append_finished_threads.super___atomic_base<int>,0);
  do {
    _Var1 = std::__atomic_base::operator_cast_to_int(in_stack_fffffffffffffde8);
  } while (_Var1 != 10);
  paVar3 = &local_1c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,"COMMIT;",paVar3);
  duckdb::Connection::Query(local_1a8);
  duckdb::
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                 *)0x77c922);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  duckdb::Value::~Value(local_e8);
  duckdb::
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                 *)0x77c950);
  duckdb::Connection::~Connection(local_38);
  return;
}

Assistant:

static void insert_random_elements(DuckDB *db, bool *correct, int threadnr) {
	correct[threadnr] = true;
	Connection con(*db);
	// initial count
	con.Query("BEGIN TRANSACTION;");
	auto result = con.Query("SELECT COUNT(*) FROM integers");
	Value count = result->GetValue(0, 0);
	auto start_count = count.GetValue<int64_t>();
	for (size_t i = 0; i < CONCURRENT_APPEND_INSERT_ELEMENTS; i++) {
		// count should increase by one for every append we do
		con.Query("INSERT INTO integers VALUES (3)");
		result = con.Query("SELECT COUNT(*) FROM integers");
		Value new_count = result->GetValue(0, 0);
		if (new_count != start_count + i + 1) {
			correct[threadnr] = false;
		}
		count = new_count;
	}
	append_finished_threads++;
	while (append_finished_threads != CONCURRENT_APPEND_THREAD_COUNT)
		;
	con.Query("COMMIT;");
}